

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O0

void jpeg_idct_7x7(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                  JSAMPARRAY output_buf,JDIMENSION output_col)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  undefined1 *puVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long in_RCX;
  short *in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  int ctr;
  JSAMPLE *range_limit;
  JSAMPROW outptr;
  int *wsptr;
  ISLOW_MULT_TYPE *quantptr;
  JCOEFPTR inptr;
  JLONG z3;
  JLONG z2;
  JLONG z1;
  JLONG tmp13;
  JLONG tmp12;
  JLONG tmp11;
  JLONG tmp10;
  JLONG tmp2;
  JLONG tmp1;
  JLONG tmp0;
  int local_168 [7];
  int local_14c [7];
  int local_130 [7];
  int local_114 [7];
  int local_f8 [7];
  int local_dc [7];
  int local_c0 [7];
  int local_a4;
  long local_a0;
  int *local_90;
  short *local_88;
  short *local_80;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  uint local_24;
  long local_20;
  
  local_a0 = *(long *)(in_RDI + 0x1a8) + 0x80;
  local_88 = *(short **)(in_RSI + 0x58);
  local_90 = local_168;
  local_80 = in_RDX;
  local_24 = in_R8D;
  local_20 = in_RCX;
  for (local_a4 = 0; local_a4 < 7; local_a4 = local_a4 + 1) {
    local_60 = (long)((int)*local_80 * (int)*local_88) * 0x2000 + 0x400;
    lVar1 = (long)((int)local_80[0x10] * (int)local_88[0x10]);
    lVar2 = (long)((int)local_80[0x20] * (int)local_88[0x20]);
    lVar3 = (long)((int)local_80[0x30] * (int)local_88[0x30]);
    local_48 = (lVar2 - lVar3) * 0x1c37;
    local_58 = (lVar1 - lVar2) * 0xa12;
    local_50 = local_48 + local_58 + local_60 + lVar2 * -0x3aeb;
    lVar4 = (lVar1 + lVar3) * 0x28c6 + local_60;
    local_48 = lVar4 + lVar3 * -0x27d + local_48;
    local_58 = lVar4 + lVar1 * -0x4f0f + local_58;
    local_60 = (lVar2 - (lVar1 + lVar3)) * 0x2d41 + local_60;
    lVar1 = (long)((int)local_80[8] * (int)local_88[8]);
    lVar2 = (long)((int)local_80[0x18] * (int)local_88[0x18]);
    lVar3 = (long)((int)local_80[0x28] * (int)local_88[0x28]);
    lVar4 = (lVar1 + lVar2) * 0x1def;
    local_40 = (lVar2 + lVar3) * -0x2c1f;
    local_38 = local_40 + (lVar1 - lVar2) * 0x573 + lVar4;
    lVar5 = (lVar1 + lVar3) * 0x13a3;
    local_30 = lVar5 + lVar4 + (lVar1 - lVar2) * -0x573;
    local_40 = lVar5 + lVar3 * 0x3bde + local_40;
    *local_90 = (int)(local_48 + local_30 >> 0xb);
    local_90[0x2a] = (int)(local_48 - local_30 >> 0xb);
    local_90[7] = (int)(local_50 + local_38 >> 0xb);
    local_90[0x23] = (int)(local_50 - local_38 >> 0xb);
    local_90[0xe] = (int)(local_58 + local_40 >> 0xb);
    local_90[0x1c] = (int)(local_58 - local_40 >> 0xb);
    local_90[0x15] = (int)(local_60 >> 0xb);
    local_80 = local_80 + 1;
    local_88 = local_88 + 1;
    local_90 = local_90 + 1;
  }
  local_90 = local_168;
  for (local_a4 = 0; local_a4 < 7; local_a4 = local_a4 + 1) {
    puVar6 = (undefined1 *)(*(long *)(local_20 + (long)local_a4 * 8) + (ulong)local_24);
    lVar1 = ((long)*local_90 + 0x10) * 0x2000;
    lVar2 = (long)local_90[2];
    lVar3 = (long)local_90[4];
    lVar4 = (long)local_90[6];
    lVar7 = (lVar3 - lVar4) * 0x1c37;
    lVar8 = (lVar2 - lVar3) * 0xa12;
    lVar5 = lVar7 + lVar8 + lVar1 + lVar3 * -0x3aeb;
    lVar9 = (lVar2 + lVar4) * 0x28c6 + lVar1;
    lVar7 = lVar9 + lVar4 * -0x27d + lVar7;
    lVar8 = lVar9 + lVar2 * -0x4f0f + lVar8;
    lVar9 = (long)local_90[1];
    lVar10 = (long)local_90[3];
    lVar11 = (long)local_90[5];
    lVar12 = (lVar9 + lVar10) * 0x1def;
    lVar13 = (lVar10 + lVar11) * -0x2c1f;
    lVar14 = lVar13 + (lVar9 - lVar10) * 0x573 + lVar12;
    lVar15 = (lVar9 + lVar11) * 0x13a3;
    lVar9 = lVar15 + lVar12 + (lVar9 - lVar10) * -0x573;
    lVar13 = lVar15 + lVar11 * 0x3bde + lVar13;
    *puVar6 = *(undefined1 *)(local_a0 + (int)((uint)(lVar7 + lVar9 >> 0x12) & 0x3ff));
    puVar6[6] = *(undefined1 *)(local_a0 + (int)((uint)(lVar7 - lVar9 >> 0x12) & 0x3ff));
    puVar6[1] = *(undefined1 *)(local_a0 + (int)((uint)(lVar5 + lVar14 >> 0x12) & 0x3ff));
    puVar6[5] = *(undefined1 *)(local_a0 + (int)((uint)(lVar5 - lVar14 >> 0x12) & 0x3ff));
    puVar6[2] = *(undefined1 *)(local_a0 + (int)((uint)(lVar8 + lVar13 >> 0x12) & 0x3ff));
    puVar6[4] = *(undefined1 *)(local_a0 + (int)((uint)(lVar8 - lVar13 >> 0x12) & 0x3ff));
    puVar6[3] = *(undefined1 *)
                 (local_a0 +
                 (int)((uint)((lVar3 - (lVar2 + lVar4)) * 0x2d41 + lVar1 >> 0x12) & 0x3ff));
    local_90 = local_90 + 7;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_7x7(j_decompress_ptr cinfo, jpeg_component_info *compptr,
              JCOEFPTR coef_block, JSAMPARRAY output_buf,
              JDIMENSION output_col)
{
  JLONG tmp0, tmp1, tmp2, tmp10, tmp11, tmp12, tmp13;
  JLONG z1, z2, z3;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE *quantptr;
  int *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[7 * 7];         /* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = 0; ctr < 7; ctr++, inptr++, quantptr++, wsptr++) {
    /* Even part */

    tmp13 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);
    tmp13 = LEFT_SHIFT(tmp13, CONST_BITS);
    /* Add fudge factor here for final descale. */
    tmp13 += ONE << (CONST_BITS - PASS1_BITS - 1);

    z1 = DEQUANTIZE(inptr[DCTSIZE * 2], quantptr[DCTSIZE * 2]);
    z2 = DEQUANTIZE(inptr[DCTSIZE * 4], quantptr[DCTSIZE * 4]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 6], quantptr[DCTSIZE * 6]);

    tmp10 = MULTIPLY(z2 - z3, FIX(0.881747734));     /* c4 */
    tmp12 = MULTIPLY(z1 - z2, FIX(0.314692123));     /* c6 */
    tmp11 = tmp10 + tmp12 + tmp13 - MULTIPLY(z2, FIX(1.841218003)); /* c2+c4-c6 */
    tmp0 = z1 + z3;
    z2 -= tmp0;
    tmp0 = MULTIPLY(tmp0, FIX(1.274162392)) + tmp13; /* c2 */
    tmp10 += tmp0 - MULTIPLY(z3, FIX(0.077722536));  /* c2-c4-c6 */
    tmp12 += tmp0 - MULTIPLY(z1, FIX(2.470602249));  /* c2+c4+c6 */
    tmp13 += MULTIPLY(z2, FIX(1.414213562));         /* c0 */

    /* Odd part */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1]);
    z2 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 5], quantptr[DCTSIZE * 5]);

    tmp1 = MULTIPLY(z1 + z2, FIX(0.935414347));      /* (c3+c1-c5)/2 */
    tmp2 = MULTIPLY(z1 - z2, FIX(0.170262339));      /* (c3+c5-c1)/2 */
    tmp0 = tmp1 - tmp2;
    tmp1 += tmp2;
    tmp2 = MULTIPLY(z2 + z3, -FIX(1.378756276));     /* -c1 */
    tmp1 += tmp2;
    z2 = MULTIPLY(z1 + z3, FIX(0.613604268));        /* c5 */
    tmp0 += z2;
    tmp2 += z2 + MULTIPLY(z3, FIX(1.870828693));     /* c3+c1-c5 */

    /* Final output stage */

    wsptr[7 * 0] = (int)RIGHT_SHIFT(tmp10 + tmp0, CONST_BITS - PASS1_BITS);
    wsptr[7 * 6] = (int)RIGHT_SHIFT(tmp10 - tmp0, CONST_BITS - PASS1_BITS);
    wsptr[7 * 1] = (int)RIGHT_SHIFT(tmp11 + tmp1, CONST_BITS - PASS1_BITS);
    wsptr[7 * 5] = (int)RIGHT_SHIFT(tmp11 - tmp1, CONST_BITS - PASS1_BITS);
    wsptr[7 * 2] = (int)RIGHT_SHIFT(tmp12 + tmp2, CONST_BITS - PASS1_BITS);
    wsptr[7 * 4] = (int)RIGHT_SHIFT(tmp12 - tmp2, CONST_BITS - PASS1_BITS);
    wsptr[7 * 3] = (int)RIGHT_SHIFT(tmp13, CONST_BITS - PASS1_BITS);
  }

  /* Pass 2: process 7 rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < 7; ctr++) {
    outptr = output_buf[ctr] + output_col;

    /* Even part */

    /* Add fudge factor here for final descale. */
    tmp13 = (JLONG)wsptr[0] + (ONE << (PASS1_BITS + 2));
    tmp13 = LEFT_SHIFT(tmp13, CONST_BITS);

    z1 = (JLONG)wsptr[2];
    z2 = (JLONG)wsptr[4];
    z3 = (JLONG)wsptr[6];

    tmp10 = MULTIPLY(z2 - z3, FIX(0.881747734));     /* c4 */
    tmp12 = MULTIPLY(z1 - z2, FIX(0.314692123));     /* c6 */
    tmp11 = tmp10 + tmp12 + tmp13 - MULTIPLY(z2, FIX(1.841218003)); /* c2+c4-c6 */
    tmp0 = z1 + z3;
    z2 -= tmp0;
    tmp0 = MULTIPLY(tmp0, FIX(1.274162392)) + tmp13; /* c2 */
    tmp10 += tmp0 - MULTIPLY(z3, FIX(0.077722536));  /* c2-c4-c6 */
    tmp12 += tmp0 - MULTIPLY(z1, FIX(2.470602249));  /* c2+c4+c6 */
    tmp13 += MULTIPLY(z2, FIX(1.414213562));         /* c0 */

    /* Odd part */

    z1 = (JLONG)wsptr[1];
    z2 = (JLONG)wsptr[3];
    z3 = (JLONG)wsptr[5];

    tmp1 = MULTIPLY(z1 + z2, FIX(0.935414347));      /* (c3+c1-c5)/2 */
    tmp2 = MULTIPLY(z1 - z2, FIX(0.170262339));      /* (c3+c5-c1)/2 */
    tmp0 = tmp1 - tmp2;
    tmp1 += tmp2;
    tmp2 = MULTIPLY(z2 + z3, -FIX(1.378756276));     /* -c1 */
    tmp1 += tmp2;
    z2 = MULTIPLY(z1 + z3, FIX(0.613604268));        /* c5 */
    tmp0 += z2;
    tmp2 += z2 + MULTIPLY(z3, FIX(1.870828693));     /* c3+c1-c5 */

    /* Final output stage */

    outptr[0] = range_limit[(int)RIGHT_SHIFT(tmp10 + tmp0,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[6] = range_limit[(int)RIGHT_SHIFT(tmp10 - tmp0,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[1] = range_limit[(int)RIGHT_SHIFT(tmp11 + tmp1,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[5] = range_limit[(int)RIGHT_SHIFT(tmp11 - tmp1,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[2] = range_limit[(int)RIGHT_SHIFT(tmp12 + tmp2,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[4] = range_limit[(int)RIGHT_SHIFT(tmp12 - tmp2,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[3] = range_limit[(int)RIGHT_SHIFT(tmp13,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];

    wsptr += 7;         /* advance pointer to next row */
  }
}